

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  parse_cmd_ln(argc,argv);
  iVar1 = rd_interp_wr();
  if (iVar1 != 0) {
    exit(1);
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
    parse_cmd_ln(argc, argv);

    if (rd_interp_wr() != S3_SUCCESS)
	exit(1);
    
    return 0;
}